

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxWriterDOTFormat.cpp
# Opt level: O0

string * __thiscall
psy::C::SyntaxWriterDOTFormat::terminalId_abi_cxx11_
          (string *__return_storage_ptr__,SyntaxWriterDOTFormat *this,SyntaxToken *tk)

{
  string local_40;
  SyntaxToken *local_20;
  SyntaxToken *tk_local;
  SyntaxWriterDOTFormat *this_local;
  
  local_20 = tk;
  tk_local = (SyntaxToken *)this;
  this_local = (SyntaxWriterDOTFormat *)__return_storage_ptr__;
  SyntaxToken::valueText_abi_cxx11_(&local_40,tk);
  std::operator+(__return_storage_ptr__,'t',&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string SyntaxWriterDOTFormat::terminalId(const SyntaxToken& tk)
{
    return 't' + tk.valueText();
}